

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_dictionary.hpp
# Opt level: O2

bool pd::readWordsVec(string *dict_filename,
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
                     *words_dict)

{
  _Vector_base<double,_std::allocator<double>_> *this;
  uint uVar1;
  uint uVar2;
  ostream *poVar3;
  unsigned_long_long uVar4;
  istream *piVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__return_storage_ptr__;
  undefined8 uVar6;
  undefined1 local_460 [8];
  istringstream is;
  long local_2e0;
  ifstream fi;
  uint auStack_2c0 [122];
  string local_d8 [8];
  string word;
  vector<double,_std::allocator<double>_> items_1;
  double x;
  undefined1 auStack_88 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  coords;
  
  std::ifstream::ifstream(&local_2e0,(string *)dict_filename,_S_in);
  uVar1 = *(uint *)((long)auStack_2c0 + *(long *)(local_2e0 + -0x18));
  if ((uVar1 & 5) == 0) {
    items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&line._M_string_length;
    line._M_dataplus._M_p = (pointer)0x0;
    line._M_string_length._0_1_ = 0;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&local_2e0,
               (string *)
               &items.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    auStack_88 = (undefined1  [8])0x0;
    items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ex::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_460,
              (string *)
              &items.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,' ');
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)auStack_88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_460);
    if ((long)items.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start - (long)auStack_88 != 0x40) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"File ");
      poVar3 = std::operator<<(poVar3,(string *)dict_filename);
      poVar3 = std::operator<<(poVar3," has incorrect format (wrong first line)");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    uVar4 = std::__cxx11::stoull((string *)((long)auStack_88 + 0x20),(size_t *)0x0,10);
    while( true ) {
      __return_storage_ptr__ =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&line.field_2 + 8);
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_2e0,
                          (string *)
                          &items.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) ||
         (line._M_dataplus._M_p == (pointer)0x0)) break;
      ex::split(__return_storage_ptr__,
                (string *)
                &items.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,' ');
      if ((long)coords.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start - line.field_2._8_8_ >> 5 ==
          (ulong)((int)uVar4 + 1)) {
        std::__cxx11::string::string(local_d8,(string *)line.field_2._8_8_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::erase(__return_storage_ptr__,(const_iterator)line.field_2._8_8_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (line.field_2._8_8_ + 0x20));
        items_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        word.field_2._8_8_ = 0;
        items_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        uVar6 = line.field_2._8_8_;
        do {
          if ((pointer)uVar6 ==
              coords.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) break;
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)local_460,(string *)uVar6,_S_in);
          items_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          piVar5 = std::istream::_M_extract<double>((double *)local_460);
          uVar2 = *(uint *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18) + 0x20);
          if ((uVar2 & 5) == 0) {
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)((long)&word.field_2 + 8),
                       (value_type_conflict1 *)
                       &items_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
          }
          else {
            poVar3 = std::operator<<((ostream *)&std::cerr,"Line ");
            poVar3 = std::operator<<(poVar3,(string *)
                                            &items.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
            poVar3 = std::operator<<(poVar3," has incorrect numbers");
            std::endl<char,std::char_traits<char>>(poVar3);
          }
          std::__cxx11::istringstream::~istringstream((istringstream *)local_460);
          uVar6 = uVar6 + 0x20;
        } while ((uVar2 & 5) == 0);
        this = (_Vector_base<double,_std::allocator<double>_> *)((long)&word.field_2 + 8);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<double,std::allocator<double>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::__cxx11::string&,std::vector<double,std::allocator<double>>&>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<double,std::allocator<double>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)words_dict,local_d8,this);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(this);
        std::__cxx11::string::~string(local_d8);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Incorrect line ");
        poVar3 = std::operator<<(poVar3,(string *)
                                        &items.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&line.field_2 + 8));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_88);
    std::__cxx11::string::~string
              ((string *)
               &items.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"File ");
    poVar3 = std::operator<<(poVar3,(string *)dict_filename);
    poVar3 = std::operator<<(poVar3," doesn\'t exist");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::ifstream::~ifstream(&local_2e0);
  return (uVar1 & 5) == 0;
}

Assistant:

bool readWordsVec(const std::string& dict_filename, std::unordered_map<std::string, std::vector<double>>& words_dict)
    {
        std::ifstream fi(dict_filename);
        if (not fi)
        {
            std::cerr << "File " << dict_filename << " doesn't exist" << std::endl;
            return false;
        }

        std::string line;
        
        //read first line and get number of features
        std::getline(fi, line);
        std::vector<std::string> items;
        items = ex::split(line, ' ');
        if (items.size() != 2)
            std::cerr << "File " << dict_filename << " has incorrect format (wrong first line)" << std::endl;
        
        uint32_t num_features = 0;
        try
        {
            num_features = std::stoull(items[1]);
        }
        catch (std::invalid_argument& exc)
        {
            std::cerr << "Incorrect first line of file " << dict_filename << std::endl;
        }
        
        while (std::getline(fi, line) and !line.empty())
        {
            std::vector<std::string> coords = ex::split(line, ' ');
            if (coords.size() != num_features + 1)
            {
                std::cerr << "Incorrect line " << line << std::endl; 
                continue;
            }
            
            std::string word = coords[0];
            coords.erase(coords.begin(), coords.begin() + 1);
            std::vector<double> items; 
            for (const std::string& s: coords)
            {
                std::istringstream is(s);
                double x = 0;
                if (!(is >> x))
                {
                    std::cerr << "Line " << line << " has incorrect numbers" << std::endl;
                    break;
                }
                items.push_back(x);
            }                     
            words_dict.emplace(word, items);
        }        
        return true;
    }